

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O2

char * get_mods_name(wchar_t mods)

{
  size_t sVar1;
  char *pcVar2;
  
  if (mods == L'\0') {
    pcVar2 = " no mods";
  }
  else {
    get_mods_name::name[0] = '\0';
    if ((mods & 1U) != 0) {
      sVar1 = strlen(get_mods_name::name);
      builtin_strncpy(get_mods_name::name + sVar1," shi",4);
      builtin_strncpy(get_mods_name::name + sVar1 + 3,"ift",4);
    }
    if ((mods & 2U) != 0) {
      sVar1 = strlen(get_mods_name::name);
      builtin_strncpy(get_mods_name::name + sVar1," control",8);
      get_mods_name::name[sVar1 + 8] = '\0';
    }
    if ((mods & 4U) != 0) {
      sVar1 = strlen(get_mods_name::name);
      builtin_strncpy(get_mods_name::name + sVar1," alt",4);
      get_mods_name::name[sVar1 + 4] = '\0';
    }
    if ((mods & 8U) != 0) {
      sVar1 = strlen(get_mods_name::name);
      builtin_strncpy(get_mods_name::name + sVar1," sup",4);
      builtin_strncpy(get_mods_name::name + sVar1 + 3,"per",4);
    }
    if ((mods & 0x10U) != 0) {
      sVar1 = strlen(get_mods_name::name);
      builtin_strncpy(get_mods_name::name + sVar1," capsloc",8);
      builtin_strncpy(get_mods_name::name + sVar1 + 5,"lock-on",8);
    }
    if ((mods & 0x20U) == 0) {
      pcVar2 = get_mods_name::name;
    }
    else {
      pcVar2 = get_mods_name::name;
      sVar1 = strlen(get_mods_name::name);
      builtin_strncpy(get_mods_name::name + sVar1," numlock",8);
      builtin_strncpy(get_mods_name::name + sVar1 + 8,"-on",4);
    }
  }
  return pcVar2;
}

Assistant:

static const char* get_mods_name(int mods)
{
    static char name[512];

    if (mods == 0)
        return " no mods";

    name[0] = '\0';

    if (mods & GLFW_MOD_SHIFT)
        strcat(name, " shift");
    if (mods & GLFW_MOD_CONTROL)
        strcat(name, " control");
    if (mods & GLFW_MOD_ALT)
        strcat(name, " alt");
    if (mods & GLFW_MOD_SUPER)
        strcat(name, " super");
    if (mods & GLFW_MOD_CAPS_LOCK)
        strcat(name, " capslock-on");
    if (mods & GLFW_MOD_NUM_LOCK)
        strcat(name, " numlock-on");

    return name;
}